

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Color GetColor(int hexValue)

{
  undefined4 local_c;
  int hexValue_local;
  Color color;
  
  local_c._1_1_ = (char)((uint)hexValue >> 0x10);
  local_c._0_1_ = (char)((uint)hexValue >> 0x18);
  local_c._2_1_ = (char)((uint)hexValue >> 8);
  local_c._3_1_ = (uchar)hexValue;
  return local_c;
}

Assistant:

Color GetColor(int hexValue)
{
    Color color;

    color.r = (unsigned char)(hexValue >> 24) & 0xFF;
    color.g = (unsigned char)(hexValue >> 16) & 0xFF;
    color.b = (unsigned char)(hexValue >> 8) & 0xFF;
    color.a = (unsigned char)hexValue & 0xFF;

    return color;
}